

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memheap.cpp
# Opt level: O0

void __thiscall CHeap::NewChunk(CHeap *this)

{
  long *plVar1;
  long *in_RDI;
  CChunk *pChunk;
  char *pMem;
  
  plVar1 = (long *)mem_alloc(0);
  if (plVar1 != (long *)0x0) {
    *plVar1 = (long)(plVar1 + 4);
    plVar1[1] = *plVar1;
    plVar1[2] = *plVar1 + 0x10000;
    plVar1[3] = *in_RDI;
    *in_RDI = (long)plVar1;
  }
  return;
}

Assistant:

void CHeap::NewChunk()
{
	// allocate memory
	char *pMem = (char*)mem_alloc(sizeof(CChunk)+CHUNK_SIZE);
	if(!pMem)
		return;

	// the chunk structure is located in the begining of the chunk
	// init it and return the chunk
	CChunk *pChunk = (CChunk*)pMem;
	pChunk->m_pMemory = (char*)(pChunk+1);
	pChunk->m_pCurrent = pChunk->m_pMemory;
	pChunk->m_pEnd = pChunk->m_pMemory + CHUNK_SIZE;
	pChunk->m_pNext = m_pCurrent;

	m_pCurrent = pChunk;
}